

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O1

void __thiscall
SleighBuilder::SleighBuilder
          (SleighBuilder *this,ParserWalker *w,DisassemblyCache *dcache,PcodeCacher *pc,
          AddrSpace *cspc,AddrSpace *uspc,uint4 umask)

{
  ParserContext *pPVar1;
  
  (this->super_PcodeBuilder).labelbase = 0;
  (this->super_PcodeBuilder).labelcount = 0;
  (this->super_PcodeBuilder)._vptr_PcodeBuilder = (_func_int **)&PTR_dump_003cc560;
  (this->super_PcodeBuilder).walker = w;
  this->discache = dcache;
  this->cache = pc;
  this->const_space = cspc;
  this->uniq_space = uspc;
  this->uniquemask = (ulong)umask;
  pPVar1 = w->cross_context;
  if (pPVar1 == (ParserContext *)0x0) {
    pPVar1 = w->const_context;
  }
  this->uniqueoffset = (ulong)((uint)(pPVar1->addr).offset & umask) << 4;
  return;
}

Assistant:

SleighBuilder::SleighBuilder(ParserWalker *w,DisassemblyCache *dcache,PcodeCacher *pc,AddrSpace *cspc,
			     AddrSpace *uspc,uint4 umask)
  : PcodeBuilder(0)
{
  walker = w;
  discache = dcache;
  cache = pc;
  const_space = cspc;
  uniq_space = uspc;
  uniquemask = umask;
  uniqueoffset = (walker->getAddr().getOffset() & uniquemask)<<4;
}